

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agentf.c
# Opt level: O2

void agentf_free(Channel *chan)

{
  if (chan->vt == &agentf_channelvt) {
    if (chan[-1].vt != (ChannelVtable *)0x0) {
      agent_cancel_query((agent_pending_query *)chan[-1].vt);
    }
    bufchain_clear((bufchain *)&chan[-4].initial_fixed_window_size);
    safefree(chan + -4);
    return;
  }
  __assert_fail("chan->vt == &agentf_channelvt",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/agentf.c",
                0xbe,"void agentf_free(Channel *)");
}

Assistant:

static void agentf_free(Channel *chan)
{
    assert(chan->vt == &agentf_channelvt);
    agentf *af = container_of(chan, agentf, chan);

    if (af->pending)
        agent_cancel_query(af->pending);
    bufchain_clear(&af->inbuffer);
    sfree(af);
}